

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O0

bool boost::xpressive::detail::set_transform
               (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                *iter,transform_op trans,transform_scope scope)

{
  transform_scope scope_local;
  transform_op trans_local;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *iter_local;
  
  if (scope == scope_next) {
    iter->next_ = trans;
  }
  else {
    iter->rest_ = trans;
  }
  return true;
}

Assistant:

bool set_transform(case_converting_iterator &iter, transform_op trans, transform_scope scope)
    {
        BOOST_ASSERT(scope == scope_next || scope == scope_rest);
        if(scope == scope_next)
            iter.next_ = trans;
        else
            iter.rest_ = trans;
        return true;
    }